

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O3

int ply_read_line(p_ply ply)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  char *pcVar4;
  
  sVar1 = ply->buffer_first;
  pcVar4 = strchr(ply->buffer + sVar1,10);
  if (pcVar4 != (char *)0x0) {
    ply->buffer_token = sVar1;
    pcVar4 = pcVar4 + (sVar1 - (long)(ply->buffer + sVar1));
LAB_001496e4:
    ply->buffer_first = (size_t)pcVar4;
    ply->buffer[(long)pcVar4] = '\0';
    ply->buffer_first = ply->buffer_first + 1;
    iVar3 = ply_check_line(ply);
    return iVar3;
  }
  sVar2 = ply->buffer_last;
  iVar3 = BREFILL(ply);
  if (iVar3 == 0) {
    pcVar4 = "Unexpected end of file";
  }
  else {
    pcVar4 = strchr(ply->buffer + (sVar2 - sVar1),10);
    if (pcVar4 != (char *)0x0) {
      ply->buffer_token = ply->buffer_first;
      pcVar4 = pcVar4 + -(long)ply->buffer;
      goto LAB_001496e4;
    }
    pcVar4 = "Token too large";
  }
  ply_ferror(ply,pcVar4);
  return 0;
}

Assistant:

static int ply_read_line(p_ply ply) {
    const char *end = NULL;
    assert(ply && ply->fp && ply->io_mode == PLY_READ);
    /* look for a end of line */
    end = strchr(BFIRST(ply), '\n');
    /* if we didn't reach the end of the buffer, we are done */
    if (end) {
        ply->buffer_token = ply->buffer_first;
        BSKIP(ply, end - BFIRST(ply));
        *BFIRST(ply) = '\0';
        BSKIP(ply, 1);
        return ply_check_line(ply);
    } else {
        end = ply->buffer + BSIZE(ply);
        /* otherwise, try to refill buffer */
        if (!BREFILL(ply)) {
            ply_ferror(ply, "Unexpected end of file");
            return 0;
        }
    }
    /* keep looking from where we left */
    end = strchr(end, '\n');
    /* check if the token is too large for our buffer */
    if (!end) {
        ply_ferror(ply, "Token too large");
        return 0;
    }
    /* we are done */
    ply->buffer_token = ply->buffer_first;
    BSKIP(ply, end - BFIRST(ply));
    *BFIRST(ply) = '\0';
    BSKIP(ply, 1);
    return ply_check_line(ply);
}